

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::resolve_tags(Tree *this)

{
  size_t sVar1;
  
  if (this->m_size != 0) {
    sVar1 = num_tag_directives(this);
    if (sVar1 != 0) {
      sVar1 = root_id(this);
      sVar1 = anon_unknown_0::_count_resolved_tags_size(this,sVar1);
      if (sVar1 != 0) {
        reserve_arena(this,sVar1 + this->m_arena_pos);
      }
      sVar1 = root_id(this);
      anon_unknown_0::_resolve_tags(this,sVar1);
      return;
    }
  }
  return;
}

Assistant:

inline bool   empty() const { return m_size == 0; }